

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  stbi_uc *psVar6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  char *pcVar15;
  int unaff_EBP;
  stbi_uc sVar16;
  uint uVar17;
  stbi_uc *psVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long *in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00154bf4:
    a->num_bits = 0;
    a->hit_zeof_once = 0;
    a->code_buffer = 0;
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x20);
    do {
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar12 = a->num_bits;
      uVar9 = a->code_buffer;
      a->code_buffer = uVar9 >> 1;
      a->num_bits = iVar12 + -1;
      if (iVar12 < 3) {
        stbi__fill_bits(a);
      }
      iVar12 = a->num_bits;
      uVar14 = a->code_buffer;
      a->code_buffer = uVar14 >> 2;
      a->num_bits = iVar12 - 2U;
      switch(uVar14 & 3) {
      case 0:
        uVar14 = iVar12 - 2U & 7;
        if (uVar14 != 0) {
          if (iVar12 < 2) {
            stbi__fill_bits(a);
          }
          a->code_buffer = a->code_buffer >> (sbyte)uVar14;
          a->num_bits = a->num_bits - uVar14;
        }
        iVar12 = a->num_bits;
        if (iVar12 < 1) {
          uVar13 = 0;
        }
        else {
          uVar14 = a->code_buffer;
          uVar13 = 0;
          iVar21 = iVar12;
          do {
            *(char *)((long)local_814.fast + uVar13) = (char)uVar14;
            uVar13 = uVar13 + 1;
            uVar14 = uVar14 >> 8;
            iVar12 = iVar21 + -8;
            bVar7 = 8 < iVar21;
            iVar21 = iVar12;
          } while (bVar7);
          a->code_buffer = uVar14;
          a->num_bits = iVar12;
        }
        if (iVar12 < 0) {
LAB_001555c6:
          pcVar15 = "zlib corrupt";
LAB_001555d6:
          *puVar1 = pcVar15;
        }
        else {
          if ((uint)uVar13 < 4) {
            psVar18 = a->zbuffer;
            psVar6 = a->zbuffer_end;
            uVar13 = uVar13 & 0xffffffff;
            do {
              if (psVar18 < psVar6) {
                a->zbuffer = psVar18 + 1;
                sVar16 = *psVar18;
                psVar18 = psVar18 + 1;
              }
              else {
                sVar16 = '\0';
              }
              *(stbi_uc *)((long)local_814.fast + uVar13) = sVar16;
              uVar13 = uVar13 + 1;
            } while (uVar13 != 4);
          }
          if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) goto LAB_001555c6;
          uVar13 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar13) {
            pcVar15 = "read past buffer";
            goto LAB_001555d6;
          }
          if ((a->zout + uVar13 <= a->zout_end) ||
             (iVar12 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar12 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar13);
            a->zbuffer = a->zbuffer + uVar13;
            a->zout = a->zout + uVar13;
            goto LAB_00155581;
          }
        }
        goto switchD_00154c8d_caseD_3;
      case 1:
        iVar12 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar12 == 0) goto switchD_00154c8d_caseD_3;
        psVar18 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar21 = 0x20;
        break;
      case 2:
        if (iVar12 < 7) {
          stbi__fill_bits(a);
        }
        iVar12 = a->num_bits;
        uVar14 = a->code_buffer;
        a->code_buffer = uVar14 >> 5;
        a->num_bits = iVar12 + -5;
        if (iVar12 < 10) {
          stbi__fill_bits(a);
        }
        iVar12 = a->num_bits;
        uVar17 = a->code_buffer;
        a->code_buffer = uVar17 >> 5;
        a->num_bits = iVar12 + -5;
        if (iVar12 < 9) {
          stbi__fill_bits(a);
        }
        uVar14 = uVar14 & 0x1f;
        iVar12 = uVar14 + 0x101;
        iVar21 = (uVar17 & 0x1f) + 1;
        uVar17 = a->code_buffer;
        a->code_buffer = uVar17 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar23 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar11 = a->code_buffer;
          a->code_buffer = uVar11 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[lVar23]] =
               (byte)uVar11 & 7;
          lVar23 = lVar23 + 1;
        } while ((ulong)(uVar17 & 0xf) + 4 != lVar23);
        iVar10 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar10 == 0) goto switchD_00154c8d_caseD_3;
        iVar10 = iVar21 + iVar12;
        iVar22 = 0;
        while( true ) {
          if (iVar10 <= iVar22) break;
          if (a->num_bits < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_00154e5a;
            }
            uVar17 = 0xffffffff;
            if (a->hit_zeof_once == 0) {
              a->hit_zeof_once = 1;
              a->num_bits = a->num_bits + 0x10;
              goto LAB_00154e5a;
            }
          }
          else {
LAB_00154e5a:
            uVar11 = a->code_buffer;
            uVar8 = local_814.fast[uVar11 & 0x1ff];
            if (uVar8 == 0) {
              uVar8 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
              uVar17 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
              uVar17 = (uVar17 >> 2 & 0x3333) + (uVar17 & 0x3333) * 4;
              uVar2 = (uVar17 >> 1 & 0x5555) + (uVar17 & 0x5555) * 2;
              lVar23 = 0;
              do {
                lVar19 = lVar23;
                lVar23 = lVar19 + 1;
              } while (local_814.maxcode[lVar19 + 10] <= (int)uVar2);
              uVar17 = 0xffffffff;
              if (((lVar19 + 10U < 0x10) &&
                  (lVar20 = (ulong)local_814.firstsymbol[lVar19 + 10] +
                            ((ulong)(uVar2 >> (7U - (char)lVar23 & 0x1f)) -
                            (ulong)local_814.firstcode[lVar19 + 10]), (int)lVar20 < 0x120)) &&
                 ((ulong)*(byte *)((long)&local_814 + lVar20 + 0x484) - 9 == lVar23)) {
                a->code_buffer = uVar11 >> ((byte)(lVar19 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar23) + -9;
                uVar17 = (uint)*(ushort *)((long)&local_814 + lVar20 * 2 + 0x5a4);
              }
            }
            else {
              a->code_buffer = uVar11 >> ((byte)(uVar8 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
              uVar17 = uVar8 & 0x1ff;
            }
          }
          if (uVar17 < 0x13) {
            if ((int)uVar17 < 0x10) {
              lVar23 = (long)iVar22;
              iVar22 = iVar22 + 1;
              abStack_9e9[lVar23 + 1] = (char)uVar17;
              bVar7 = true;
            }
            else {
              iVar3 = a->num_bits;
              if (uVar17 != 0x11) {
                if (uVar17 != 0x10) {
                  if (iVar3 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar17 = a->code_buffer;
                  a->code_buffer = uVar17 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar17 = (uVar17 & 0x7f) + 0xb;
                  goto LAB_00154ff5;
                }
                if (iVar3 < 2) {
                  stbi__fill_bits(a);
                }
                uVar17 = a->code_buffer;
                a->code_buffer = uVar17 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar22 != 0) {
                  uVar17 = (uVar17 & 3) + 3;
                  uVar11 = (uint)abStack_9e9[iVar22];
                  goto LAB_00154ff7;
                }
                *puVar1 = "bad codelengths";
                iVar22 = 0;
                goto LAB_00154f41;
              }
              if (iVar3 < 3) {
                stbi__fill_bits(a);
              }
              uVar17 = a->code_buffer;
              a->code_buffer = uVar17 >> 3;
              a->num_bits = a->num_bits + -3;
              uVar17 = (uVar17 & 7) + 3;
LAB_00154ff5:
              uVar11 = 0;
LAB_00154ff7:
              if (iVar10 - iVar22 < (int)uVar17) goto LAB_00154f3e;
              memset(abStack_9e9 + (long)iVar22 + 1,uVar11,(ulong)uVar17);
              iVar22 = iVar22 + uVar17;
              bVar7 = true;
            }
          }
          else {
LAB_00154f3e:
            *puVar1 = "bad codelengths";
LAB_00154f41:
            bVar7 = false;
          }
          if (!bVar7) goto switchD_00154c8d_caseD_3;
        }
        if (iVar10 != iVar22) {
          *puVar1 = "bad codelengths";
          goto switchD_00154c8d_caseD_3;
        }
        iVar12 = stbi__zbuild_huffman(&a->z_length,(stbi_uc *)((long)abStack_9e9 + 1),iVar12);
        if (iVar12 == 0) goto switchD_00154c8d_caseD_3;
        psVar18 = asStack_8e7 + uVar14;
        unaff_EBP = 0;
        break;
      case 3:
        goto switchD_00154c8d_caseD_3;
      }
      iVar12 = stbi__zbuild_huffman(&a->z_distance,psVar18,iVar21);
      if (iVar12 == 0) goto switchD_00154c8d_caseD_3;
      pcVar15 = a->zout;
      do {
        if (a->num_bits < 0x10) {
          if (a->zbuffer < a->zbuffer_end) {
            stbi__fill_bits(a);
            goto LAB_001550d2;
          }
          uVar14 = 0xffffffff;
          if (a->hit_zeof_once == 0) {
            a->hit_zeof_once = 1;
            a->num_bits = a->num_bits + 0x10;
            goto LAB_001550d2;
          }
        }
        else {
LAB_001550d2:
          uVar17 = a->code_buffer;
          uVar8 = (a->z_length).fast[uVar17 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar17 << 8 | (ushort)uVar17 >> 8;
            uVar14 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar14 = (uVar14 >> 2 & 0x3333) + (uVar14 & 0x3333) * 4;
            uVar11 = (uVar14 >> 1 & 0x5555) + (uVar14 & 0x5555) * 2;
            lVar23 = 0;
            do {
              lVar19 = lVar23;
              lVar23 = lVar19 + 1;
            } while ((a->z_length).maxcode[lVar19 + 10] <= (int)uVar11);
            uVar14 = 0xffffffff;
            if (((lVar19 + 10U < 0x10) &&
                (lVar20 = (ulong)(a->z_length).firstsymbol[lVar19 + 10] +
                          ((ulong)(uVar11 >> (7U - (char)lVar23 & 0x1f)) -
                          (ulong)(a->z_length).firstcode[lVar19 + 10]), (int)lVar20 < 0x120)) &&
               ((ulong)*(byte *)((long)a + lVar20 + 0x4c0) - 9 == lVar23)) {
              a->code_buffer = uVar17 >> ((byte)(lVar19 + 10U) & 0x1f);
              a->num_bits = (a->num_bits - (int)lVar23) + -9;
              uVar14 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0x5e0);
            }
          }
          else {
            a->code_buffer = uVar17 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
            uVar14 = uVar8 & 0x1ff;
          }
        }
        if ((int)uVar14 < 0x100) {
          if ((int)uVar14 < 0) {
LAB_001553b4:
            *puVar1 = "bad huffman code";
LAB_001553ba:
            bVar7 = false;
            unaff_EBP = 0;
          }
          else {
            if (a->zout_end <= pcVar15) {
              iVar12 = stbi__zexpand(a,pcVar15,1);
              if (iVar12 == 0) goto LAB_001553ba;
              pcVar15 = a->zout;
            }
            *pcVar15 = (char)uVar14;
            pcVar15 = pcVar15 + 1;
            bVar7 = true;
          }
        }
        else if (uVar14 == 0x100) {
          a->zout = pcVar15;
          unaff_EBP = 1;
          if (a->hit_zeof_once == 0) {
            bVar7 = false;
          }
          else {
            bVar7 = false;
            if (a->num_bits < 0x10) {
              *puVar1 = "unexpected end";
              goto LAB_001553ba;
            }
          }
        }
        else {
          if (0x11d < (int)uVar14) goto LAB_001553b4;
          uVar13 = (ulong)(uVar14 - 0x101);
          uVar14 = stbi__zlength_base[uVar13];
          if (0xffffffffffffffeb < uVar13 - 0x1c) {
            iVar12 = stbi__zlength_extra[uVar13];
            if (a->num_bits < iVar12) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar12 & 0x1f);
            a->num_bits = a->num_bits - iVar12;
            uVar14 = uVar14 + (~(-1 << ((byte)iVar12 & 0x1f)) & uVar17);
          }
          if (a->num_bits < 0x10) {
            if (a->zbuffer < a->zbuffer_end) {
              stbi__fill_bits(a);
              goto LAB_001552c9;
            }
            uVar17 = 0xffffffff;
            if (a->hit_zeof_once == 0) {
              a->hit_zeof_once = 1;
              a->num_bits = a->num_bits + 0x10;
              goto LAB_001552c9;
            }
          }
          else {
LAB_001552c9:
            uVar11 = a->code_buffer;
            uVar8 = (a->z_distance).fast[uVar11 & 0x1ff];
            if (uVar8 == 0) {
              uVar8 = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
              uVar17 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
              uVar17 = (uVar17 >> 2 & 0x3333) + (uVar17 & 0x3333) * 4;
              uVar2 = (uVar17 >> 1 & 0x5555) + (uVar17 & 0x5555) * 2;
              lVar23 = 0;
              do {
                lVar19 = lVar23;
                lVar23 = lVar19 + 1;
              } while ((a->z_distance).maxcode[lVar19 + 10] <= (int)uVar2);
              uVar17 = 0xffffffff;
              if (((lVar19 + 10U < 0x10) &&
                  (lVar20 = (ulong)(a->z_distance).firstsymbol[lVar19 + 10] +
                            ((ulong)(uVar2 >> (7U - (char)lVar23 & 0x1f)) -
                            (ulong)(a->z_distance).firstcode[lVar19 + 10]), (int)lVar20 < 0x120)) &&
                 ((ulong)*(byte *)((long)a + lVar20 + 0xca4) - 9 == lVar23)) {
                a->code_buffer = uVar11 >> ((byte)(lVar19 + 10U) & 0x1f);
                a->num_bits = (a->num_bits - (int)lVar23) + -9;
                uVar17 = (uint)*(ushort *)((long)a + lVar20 * 2 + 0xdc4);
              }
            }
            else {
              a->code_buffer = uVar11 >> ((byte)(uVar8 >> 9) & 0x1f);
              a->num_bits = a->num_bits - (uint)(uVar8 >> 9);
              uVar17 = uVar8 & 0x1ff;
            }
          }
          if (0x1d < uVar17) goto LAB_001553b4;
          uVar13 = (ulong)uVar17;
          iVar12 = stbi__zdist_base[uVar13];
          if (0xffffffffffffffe5 < uVar13 - 0x1e) {
            iVar21 = stbi__zdist_extra[uVar13];
            if (a->num_bits < iVar21) {
              stbi__fill_bits(a);
            }
            uVar17 = a->code_buffer;
            a->code_buffer = uVar17 >> ((byte)iVar21 & 0x1f);
            a->num_bits = a->num_bits - iVar21;
            iVar12 = iVar12 + (~(-1 << ((byte)iVar21 & 0x1f)) & uVar17);
          }
          if ((long)pcVar15 - (long)a->zout_start < (long)iVar12) {
            *puVar1 = "bad dist";
            bVar7 = false;
            unaff_EBP = 0;
          }
          else {
            if ((long)a->zout_end - (long)pcVar15 < (long)(int)uVar14) {
              iVar21 = stbi__zexpand(a,pcVar15,uVar14);
              if (iVar21 == 0) {
                bVar7 = false;
                unaff_EBP = 0;
                goto LAB_001553bc;
              }
              pcVar15 = a->zout;
            }
            lVar23 = -(long)iVar12;
            bVar7 = true;
            if (iVar12 == 1) {
              if (uVar14 != 0) {
                memset(pcVar15,(uint)(byte)pcVar15[lVar23],(ulong)uVar14);
                pcVar15 = pcVar15 + (ulong)(uVar14 - 1) + 1;
              }
            }
            else {
              for (; uVar14 != 0; uVar14 = uVar14 - 1) {
                *pcVar15 = pcVar15[lVar23];
                pcVar15 = pcVar15 + 1;
              }
            }
          }
        }
LAB_001553bc:
      } while (bVar7);
      if (unaff_EBP == 0) {
        return 0;
      }
LAB_00155581:
    } while ((uVar9 & 1) == 0);
    iVar12 = 1;
  }
  else {
    pbVar4 = a->zbuffer;
    pbVar5 = a->zbuffer_end;
    uVar14 = 0;
    uVar9 = 0;
    if (pbVar4 < pbVar5) {
      a->zbuffer = pbVar4 + 1;
      uVar9 = (uint)*pbVar4;
    }
    pbVar4 = a->zbuffer;
    if (pbVar4 < pbVar5) {
      a->zbuffer = pbVar4 + 1;
      uVar14 = (uint)*pbVar4;
    }
    if ((a->zbuffer < pbVar5) && ((uVar9 << 8 | uVar14) * -0x42108421 < 0x8421085)) {
      if ((uVar14 & 0x20) == 0) {
        if ((uVar9 & 0xf) == 8) goto LAB_00154bf4;
        lVar23 = *in_FS_OFFSET;
        pcVar15 = "bad compression";
      }
      else {
        lVar23 = *in_FS_OFFSET;
        pcVar15 = "no preset dict";
      }
    }
    else {
      lVar23 = *in_FS_OFFSET;
      pcVar15 = "bad zlib header";
    }
    *(char **)(lVar23 + -0x20) = pcVar15;
switchD_00154c8d_caseD_3:
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}